

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_converter.cc
# Opt level: O2

void __thiscall
webrtc::AudioConverter::CheckSizes(AudioConverter *this,size_t src_size,size_t dst_capacity)

{
  string *result;
  int line;
  size_t local_190;
  size_t local_188;
  FatalMessage local_180;
  
  local_180._0_8_ = this->src_frames_ * this->src_channels_;
  local_190 = dst_capacity;
  local_188 = src_size;
  result = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                     (&local_188,(unsigned_long *)&local_180,
                      "src_size == src_channels() * src_frames()");
  if (result == (string *)0x0) {
    local_180._0_8_ = this->dst_frames_ * this->dst_channels_;
    result = rtc::CheckGEImpl<unsigned_long,unsigned_long>
                       (&local_190,(unsigned_long *)&local_180,
                        "dst_capacity >= dst_channels() * dst_frames()");
    if (result == (string *)0x0) {
      return;
    }
    line = 0xcb;
  }
  else {
    line = 0xca;
  }
  rtc::FatalMessage::FatalMessage
            (&local_180,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/audio_converter.cc"
             ,line,result);
  rtc::FatalMessage::~FatalMessage(&local_180);
}

Assistant:

void AudioConverter::CheckSizes(size_t src_size, size_t dst_capacity) const {
  RTC_CHECK_EQ(src_size, src_channels() * src_frames());
  RTC_CHECK_GE(dst_capacity, dst_channels() * dst_frames());
}